

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *type_names,Index binding_index_offset)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  char *pcVar4;
  string *psVar5;
  int __c;
  Type local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  undefined4 uStack_dc;
  int local_d8;
  ulong local_c8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *local_c0;
  string name;
  Location loc;
  Var type;
  
  local_c8 = (ulong)binding_index_offset;
  local_c0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)bindings;
  while( true ) {
    psVar5 = &name;
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      return (Result)Ok;
    }
    TVar2 = Peek(this,0);
    if (TVar2 == Last_String) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      Var::Var(&type);
      GetLocation(&loc,this);
      ParseBindVarOpt(this,psVar5);
      RVar3 = ParseValueType(this,&type);
      if (RVar3.enum_ == Error) {
        Var::~Var(&type);
        std::__cxx11::string::_M_dispose();
        return (Result)Error;
      }
      local_d8 = (int)((ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(types->
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 3) +
                 binding_index_offset;
      local_e8 = loc.field_1.field_0.line;
      iStack_e4 = loc.field_1.field_0.first_column;
      iStack_e0 = loc.field_1.field_0.last_column;
      uStack_dc = loc.field_1._12_4_;
      uStack_f0 = loc.filename._M_str._0_4_;
      uStack_ec = loc.filename._M_str._4_4_;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>(local_c0,psVar5,&local_f8);
      if (type.type_ == Name) {
        if ((this->options_->features).function_references_enabled_ == false) {
          __assert_fail("options_->features.function_references_enabled()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0x749,
                        "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, std::unordered_map<uint32_t, std::string> *, Index)"
                       );
        }
        local_f8 = (Type)(((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 3) + local_c8);
        psVar5 = Var::name_abi_cxx11_(&type);
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_long,std::__cxx11::string_const&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)type_names,&local_f8,psVar5);
        local_f8.enum_ = Reference;
        local_f8.type_index_ = 0xffffffff;
      }
      else {
        if (type.type_ != Index) {
          __assert_fail("type.is_name()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0x748,
                        "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, std::unordered_map<uint32_t, std::string> *, Index)"
                       );
        }
        pcVar4 = Var::index(&type,(char *)psVar5,__c);
        local_f8.type_index_ = 0xffffffff;
        local_f8.enum_ = (Enum)pcVar4;
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                (types,&local_f8);
      Var::~Var(&type);
      std::__cxx11::string::_M_dispose();
    }
    else {
      RVar3 = ParseValueTypeList(this,types,type_names);
    }
    if (RVar3.enum_ == Error) break;
    RVar3 = Expect(this,Rpar);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBoundValueTypeList(
    TokenType token,
    TypeVector* types,
    BindingHash* bindings,
    std::unordered_map<uint32_t, std::string>* type_names,
    Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Var type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      if (type.is_index()) {
        types->push_back(Type(type.index()));
      } else {
        assert(type.is_name());
        assert(options_->features.function_references_enabled());
        type_names->emplace(binding_index_offset + types->size(), type.name());
        types->push_back(Type(Type::Reference, kInvalidIndex));
      }
    } else {
      CHECK_RESULT(ParseValueTypeList(types, type_names));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}